

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<4,_257,_false,_embree::avx::VirtualCurveIntersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  byte bVar6;
  char cVar7;
  undefined4 uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  vint4 ai_1;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  vint4 ai;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vint4 ai_3;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vint4 ai_2;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vint4 bi_7;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 bi_4;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  vfloat4 a0;
  undefined1 auVar37 [16];
  vint4 bi;
  undefined1 auVar38 [16];
  float fVar39;
  vint4 bi_2;
  float fVar40;
  float fVar44;
  float fVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  float fVar47;
  float fVar51;
  float fVar52;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar59;
  float fVar60;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  Precalculations pre;
  NodeRef stack [244];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar40 = ray->tfar;
    if (0.0 <= fVar40) {
      aVar2 = (ray->dir).field_0.field_1;
      auVar26 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
      auVar27 = vrsqrtss_avx(auVar26,auVar26);
      fVar36 = auVar27._0_4_;
      local_818[0] = fVar36 * 1.5 - auVar26._0_4_ * 0.5 * fVar36 * fVar36 * fVar36;
      auVar22 = vshufps_avx(ZEXT416((uint)local_818[0]),ZEXT416((uint)local_818[0]),0);
      auVar37._0_4_ = aVar2.x * auVar22._0_4_;
      auVar37._4_4_ = aVar2.y * auVar22._4_4_;
      auVar37._8_4_ = aVar2.z * auVar22._8_4_;
      auVar37._12_4_ = aVar2.field_3.w * auVar22._12_4_;
      auVar27 = vshufpd_avx(auVar37,auVar37,1);
      auVar26 = vmovshdup_avx(auVar37);
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      auVar38._12_4_ = 0;
      auVar38._0_12_ = ZEXT812(0);
      auVar38 = auVar38 << 0x20;
      auVar31 = vunpckhps_avx(auVar37,auVar38);
      auVar23 = vshufps_avx(auVar31,ZEXT416(auVar26._0_4_ ^ 0x80000000),0x41);
      auVar41._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar41._8_8_ = auVar27._8_8_ ^ auVar62._8_8_;
      auVar31 = vinsertps_avx(auVar41,auVar37,0x2a);
      auVar26 = vdpps_avx(auVar23,auVar23,0x7f);
      auVar27 = vdpps_avx(auVar31,auVar31,0x7f);
      auVar26 = vcmpps_avx(auVar27,auVar26,1);
      auVar26 = vshufps_avx(auVar26,auVar26,0);
      auVar26 = vblendvps_avx(auVar31,auVar23,auVar26);
      auVar27 = vdpps_avx(auVar26,auVar26,0x7f);
      fVar36 = (ray->dir).field_0.m128[0];
      auVar31 = vrsqrtss_avx(auVar27,auVar27);
      fVar54 = auVar31._0_4_;
      fVar1 = (ray->dir).field_0.m128[1];
      auVar27 = ZEXT416((uint)(fVar54 * 1.5 - auVar27._0_4_ * 0.5 * fVar54 * fVar54 * fVar54));
      auVar27 = vshufps_avx(auVar27,auVar27,0);
      auVar42._0_4_ = auVar26._0_4_ * auVar27._0_4_;
      auVar42._4_4_ = auVar26._4_4_ * auVar27._4_4_;
      auVar42._8_4_ = auVar26._8_4_ * auVar27._8_4_;
      auVar42._12_4_ = auVar26._12_4_ * auVar27._12_4_;
      auVar26 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar27 = vshufps_avx(auVar37,auVar37,0xc9);
      auVar56._0_4_ = auVar27._0_4_ * auVar42._0_4_;
      auVar56._4_4_ = auVar27._4_4_ * auVar42._4_4_;
      auVar56._8_4_ = auVar27._8_4_ * auVar42._8_4_;
      auVar56._12_4_ = auVar27._12_4_ * auVar42._12_4_;
      auVar48._0_4_ = auVar26._0_4_ * auVar37._0_4_;
      auVar48._4_4_ = auVar26._4_4_ * auVar37._4_4_;
      auVar48._8_4_ = auVar26._8_4_ * auVar37._8_4_;
      auVar48._12_4_ = auVar26._12_4_ * auVar37._12_4_;
      auVar26 = vsubps_avx(auVar48,auVar56);
      auVar31 = vshufps_avx(auVar26,auVar26,0xc9);
      auVar26 = vdpps_avx(auVar31,auVar31,0x7f);
      fVar54 = (ray->dir).field_0.m128[2];
      auVar27 = vrsqrtss_avx(auVar26,auVar26);
      fVar39 = auVar27._0_4_;
      auVar26 = ZEXT416((uint)(fVar39 * 1.5 - fVar39 * fVar39 * fVar39 * auVar26._0_4_ * 0.5));
      auVar26 = vshufps_avx(auVar26,auVar26,0);
      auVar27._0_4_ = auVar31._0_4_ * auVar26._0_4_;
      auVar27._4_4_ = auVar31._4_4_ * auVar26._4_4_;
      auVar27._8_4_ = auVar31._8_4_ * auVar26._8_4_;
      auVar27._12_4_ = auVar31._12_4_ * auVar26._12_4_;
      auVar26._0_4_ = auVar22._0_4_ * auVar37._0_4_;
      auVar26._4_4_ = auVar22._4_4_ * auVar37._4_4_;
      auVar26._8_4_ = auVar22._8_4_ * auVar37._8_4_;
      auVar26._12_4_ = auVar22._12_4_ * auVar37._12_4_;
      auVar31 = vunpcklps_avx(auVar42,auVar26);
      auVar26 = vunpckhps_avx(auVar42,auVar26);
      auVar22 = vunpcklps_avx(auVar27,auVar38);
      auVar27 = vunpckhps_avx(auVar27,auVar38);
      local_7e8 = vunpcklps_avx(auVar26,auVar27);
      local_808 = vunpcklps_avx(auVar31,auVar22);
      local_7f8 = vunpckhps_avx(auVar31,auVar22);
      puVar14 = local_7d0;
      auVar27 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar31._8_4_ = 0x7fffffff;
      auVar31._0_8_ = 0x7fffffff7fffffff;
      auVar31._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx((undefined1  [16])aVar2,auVar31);
      auVar33._8_4_ = 0x219392ef;
      auVar33._0_8_ = 0x219392ef219392ef;
      auVar33._12_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar26,auVar33,1);
      auVar26 = vblendvps_avx((undefined1  [16])aVar2,auVar33,auVar26);
      auVar31 = vrcpps_avx(auVar26);
      fVar39 = auVar31._0_4_;
      auVar22._0_4_ = auVar26._0_4_ * fVar39;
      fVar4 = auVar31._4_4_;
      auVar22._4_4_ = auVar26._4_4_ * fVar4;
      fVar5 = auVar31._8_4_;
      auVar22._8_4_ = auVar26._8_4_ * fVar5;
      fVar44 = auVar31._12_4_;
      auVar22._12_4_ = auVar26._12_4_ * fVar44;
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = 0x3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar26 = vsubps_avx(auVar34,auVar22);
      auVar23._0_4_ = fVar39 + fVar39 * auVar26._0_4_;
      auVar23._4_4_ = fVar4 + fVar4 * auVar26._4_4_;
      auVar23._8_4_ = fVar5 + fVar5 * auVar26._8_4_;
      auVar23._12_4_ = fVar44 + fVar44 * auVar26._12_4_;
      fVar39 = (ray->org).field_0.m128[0];
      auVar69._4_4_ = fVar39;
      auVar69._0_4_ = fVar39;
      auVar69._8_4_ = fVar39;
      auVar69._12_4_ = fVar39;
      fVar4 = (ray->org).field_0.m128[1];
      auVar63._4_4_ = fVar4;
      auVar63._0_4_ = fVar4;
      auVar63._8_4_ = fVar4;
      auVar63._12_4_ = fVar4;
      auVar26 = vmovshdup_avx(auVar23);
      auVar31 = vshufpd_avx(auVar23,auVar23,1);
      uVar16 = (ulong)(auVar23._0_4_ < 0.0) * 0x10;
      uVar13 = (ulong)(auVar26._0_4_ < 0.0) << 4 | 0x20;
      fVar5 = (ray->org).field_0.m128[2];
      auVar65._4_4_ = fVar5;
      auVar65._0_4_ = fVar5;
      auVar65._8_4_ = fVar5;
      auVar65._12_4_ = fVar5;
      auVar26 = vshufps_avx(auVar23,auVar23,0);
      auVar22 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      uVar15 = (ulong)(auVar31._0_4_ < 0.0) << 4 | 0x40;
      auVar27 = vshufps_avx(auVar27,auVar27,0);
      auVar31 = vshufps_avx(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40),0);
LAB_00b60097:
      if (puVar14 != &local_7d8) {
        uVar10 = puVar14[-1];
        puVar14 = puVar14 + -1;
LAB_00b600a8:
        if ((uVar10 & 0xf) == 0) {
          auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar16),auVar69);
          auVar17._0_4_ = auVar26._0_4_ * auVar38._0_4_;
          auVar17._4_4_ = auVar26._4_4_ * auVar38._4_4_;
          auVar17._8_4_ = auVar26._8_4_ * auVar38._8_4_;
          auVar17._12_4_ = auVar26._12_4_ * auVar38._12_4_;
          auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar13),auVar63);
          auVar19._0_4_ = auVar22._0_4_ * auVar38._0_4_;
          auVar19._4_4_ = auVar22._4_4_ * auVar38._4_4_;
          auVar19._8_4_ = auVar22._8_4_ * auVar38._8_4_;
          auVar19._12_4_ = auVar22._12_4_ * auVar38._12_4_;
          auVar38 = vpmaxsd_avx(auVar17,auVar19);
          auVar33 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar15),auVar65);
          auVar20._0_4_ = auVar23._0_4_ * auVar33._0_4_;
          auVar20._4_4_ = auVar23._4_4_ * auVar33._4_4_;
          auVar20._8_4_ = auVar23._8_4_ * auVar33._8_4_;
          auVar20._12_4_ = auVar23._12_4_ * auVar33._12_4_;
          auVar33 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar16 ^ 0x10)),auVar69);
          auVar24._0_4_ = auVar26._0_4_ * auVar33._0_4_;
          auVar24._4_4_ = auVar26._4_4_ * auVar33._4_4_;
          auVar24._8_4_ = auVar26._8_4_ * auVar33._8_4_;
          auVar24._12_4_ = auVar26._12_4_ * auVar33._12_4_;
          auVar33 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar13 ^ 0x10)),auVar63);
          auVar28._0_4_ = auVar22._0_4_ * auVar33._0_4_;
          auVar28._4_4_ = auVar22._4_4_ * auVar33._4_4_;
          auVar28._8_4_ = auVar22._8_4_ * auVar33._8_4_;
          auVar28._12_4_ = auVar22._12_4_ * auVar33._12_4_;
          auVar34 = vpminsd_avx(auVar24,auVar28);
          auVar33 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar15 ^ 0x10)),auVar65);
          auVar29._0_4_ = auVar23._0_4_ * auVar33._0_4_;
          auVar29._4_4_ = auVar23._4_4_ * auVar33._4_4_;
          auVar29._8_4_ = auVar23._8_4_ * auVar33._8_4_;
          auVar29._12_4_ = auVar23._12_4_ * auVar33._12_4_;
          auVar33 = vpmaxsd_avx(auVar20,auVar27);
          auVar38 = vpmaxsd_avx(auVar38,auVar33);
          auVar33 = vpminsd_avx(auVar29,auVar31);
          auVar33 = vpminsd_avx(auVar34,auVar33);
          auVar38 = vpcmpgtd_avx(auVar38,auVar33);
          uVar8 = vmovmskps_avx(auVar38);
          bVar6 = (byte)uVar8 ^ 0xf;
        }
        else {
          if ((int)(uVar10 & 0xf) != 2) {
            cVar7 = (**(code **)((long)This->leafIntersector +
                                (ulong)*(byte *)(uVar10 & 0xfffffffffffffff0) * 0x40 + 8))
                              (local_818,ray,context);
            if (cVar7 != '\0') {
              ray->tfar = -INFINITY;
              return;
            }
            goto LAB_00b60097;
          }
          uVar9 = uVar10 & 0xfffffffffffffff0;
          auVar49._0_4_ =
               fVar1 * *(float *)(uVar9 + 0x50) + fVar54 * *(float *)(uVar9 + 0x80) +
               fVar36 * *(float *)(uVar9 + 0x20);
          auVar49._4_4_ =
               fVar1 * *(float *)(uVar9 + 0x54) + fVar54 * *(float *)(uVar9 + 0x84) +
               fVar36 * *(float *)(uVar9 + 0x24);
          auVar49._8_4_ =
               fVar1 * *(float *)(uVar9 + 0x58) + fVar54 * *(float *)(uVar9 + 0x88) +
               fVar36 * *(float *)(uVar9 + 0x28);
          auVar49._12_4_ =
               fVar1 * *(float *)(uVar9 + 0x5c) + fVar54 * *(float *)(uVar9 + 0x8c) +
               fVar36 * *(float *)(uVar9 + 0x2c);
          auVar57._0_4_ =
               fVar1 * *(float *)(uVar9 + 0x60) + fVar54 * *(float *)(uVar9 + 0x90) +
               fVar36 * *(float *)(uVar9 + 0x30);
          auVar57._4_4_ =
               fVar1 * *(float *)(uVar9 + 100) + fVar54 * *(float *)(uVar9 + 0x94) +
               fVar36 * *(float *)(uVar9 + 0x34);
          auVar57._8_4_ =
               fVar1 * *(float *)(uVar9 + 0x68) + fVar54 * *(float *)(uVar9 + 0x98) +
               fVar36 * *(float *)(uVar9 + 0x38);
          auVar57._12_4_ =
               fVar1 * *(float *)(uVar9 + 0x6c) + fVar54 * *(float *)(uVar9 + 0x9c) +
               fVar36 * *(float *)(uVar9 + 0x3c);
          auVar43._0_4_ =
               fVar54 * *(float *)(uVar9 + 0xa0) + fVar1 * *(float *)(uVar9 + 0x70) +
               fVar36 * *(float *)(uVar9 + 0x40);
          auVar43._4_4_ =
               fVar54 * *(float *)(uVar9 + 0xa4) + fVar1 * *(float *)(uVar9 + 0x74) +
               fVar36 * *(float *)(uVar9 + 0x44);
          auVar43._8_4_ =
               fVar54 * *(float *)(uVar9 + 0xa8) + fVar1 * *(float *)(uVar9 + 0x78) +
               fVar36 * *(float *)(uVar9 + 0x48);
          auVar43._12_4_ =
               fVar54 * *(float *)(uVar9 + 0xac) + fVar1 * *(float *)(uVar9 + 0x7c) +
               fVar36 * *(float *)(uVar9 + 0x4c);
          auVar66._8_4_ = 0x7fffffff;
          auVar66._0_8_ = 0x7fffffff7fffffff;
          auVar66._12_4_ = 0x7fffffff;
          auVar38 = vandps_avx(auVar49,auVar66);
          auVar68._8_4_ = 0x219392ef;
          auVar68._0_8_ = 0x219392ef219392ef;
          auVar68._12_4_ = 0x219392ef;
          auVar38 = vcmpps_avx(auVar38,auVar68,1);
          auVar33 = vblendvps_avx(auVar49,auVar68,auVar38);
          auVar38 = vandps_avx(auVar57,auVar66);
          auVar38 = vcmpps_avx(auVar38,auVar68,1);
          auVar34 = vblendvps_avx(auVar57,auVar68,auVar38);
          auVar38 = vandps_avx(auVar43,auVar66);
          auVar38 = vcmpps_avx(auVar38,auVar68,1);
          auVar38 = vblendvps_avx(auVar43,auVar68,auVar38);
          auVar37 = vrcpps_avx(auVar33);
          fVar40 = auVar37._0_4_;
          auVar50._0_4_ = fVar40 * auVar33._0_4_;
          fVar44 = auVar37._4_4_;
          auVar50._4_4_ = fVar44 * auVar33._4_4_;
          fVar45 = auVar37._8_4_;
          auVar50._8_4_ = fVar45 * auVar33._8_4_;
          fVar46 = auVar37._12_4_;
          auVar50._12_4_ = fVar46 * auVar33._12_4_;
          auVar67._8_4_ = 0x3f800000;
          auVar67._0_8_ = 0x3f8000003f800000;
          auVar67._12_4_ = 0x3f800000;
          auVar33 = vsubps_avx(auVar67,auVar50);
          fVar40 = fVar40 + fVar40 * auVar33._0_4_;
          fVar44 = fVar44 + fVar44 * auVar33._4_4_;
          fVar45 = fVar45 + fVar45 * auVar33._8_4_;
          fVar46 = fVar46 + fVar46 * auVar33._12_4_;
          auVar33 = vrcpps_avx(auVar34);
          fVar47 = auVar33._0_4_;
          auVar58._0_4_ = fVar47 * auVar34._0_4_;
          fVar51 = auVar33._4_4_;
          auVar58._4_4_ = fVar51 * auVar34._4_4_;
          fVar52 = auVar33._8_4_;
          auVar58._8_4_ = fVar52 * auVar34._8_4_;
          fVar53 = auVar33._12_4_;
          auVar58._12_4_ = fVar53 * auVar34._12_4_;
          auVar33 = vsubps_avx(auVar67,auVar58);
          fVar47 = fVar47 + fVar47 * auVar33._0_4_;
          fVar51 = fVar51 + fVar51 * auVar33._4_4_;
          fVar52 = fVar52 + fVar52 * auVar33._8_4_;
          fVar53 = fVar53 + fVar53 * auVar33._12_4_;
          auVar33 = vrcpps_avx(auVar38);
          fVar55 = auVar33._0_4_;
          auVar64._0_4_ = fVar55 * auVar38._0_4_;
          fVar59 = auVar33._4_4_;
          auVar64._4_4_ = fVar59 * auVar38._4_4_;
          fVar60 = auVar33._8_4_;
          auVar64._8_4_ = fVar60 * auVar38._8_4_;
          fVar61 = auVar33._12_4_;
          auVar64._12_4_ = fVar61 * auVar38._12_4_;
          auVar38 = vsubps_avx(auVar67,auVar64);
          fVar55 = fVar55 + fVar55 * auVar38._0_4_;
          fVar59 = fVar59 + fVar59 * auVar38._4_4_;
          fVar60 = fVar60 + fVar60 * auVar38._8_4_;
          fVar61 = fVar61 + fVar61 * auVar38._12_4_;
          auVar25._0_4_ =
               (fVar39 * *(float *)(uVar9 + 0x20) +
               fVar4 * *(float *)(uVar9 + 0x50) +
               fVar5 * *(float *)(uVar9 + 0x80) + *(float *)(uVar9 + 0xb0)) * -fVar40;
          auVar25._4_4_ =
               (fVar39 * *(float *)(uVar9 + 0x24) +
               fVar4 * *(float *)(uVar9 + 0x54) +
               fVar5 * *(float *)(uVar9 + 0x84) + *(float *)(uVar9 + 0xb4)) * -fVar44;
          auVar25._8_4_ =
               (fVar39 * *(float *)(uVar9 + 0x28) +
               fVar4 * *(float *)(uVar9 + 0x58) +
               fVar5 * *(float *)(uVar9 + 0x88) + *(float *)(uVar9 + 0xb8)) * -fVar45;
          auVar25._12_4_ =
               (fVar39 * *(float *)(uVar9 + 0x2c) +
               fVar4 * *(float *)(uVar9 + 0x5c) +
               fVar5 * *(float *)(uVar9 + 0x8c) + *(float *)(uVar9 + 0xbc)) * -fVar46;
          auVar21._0_4_ =
               (fVar39 * *(float *)(uVar9 + 0x30) +
               fVar4 * *(float *)(uVar9 + 0x60) +
               fVar5 * *(float *)(uVar9 + 0x90) + *(float *)(uVar9 + 0xc0)) * -fVar47;
          auVar21._4_4_ =
               (fVar39 * *(float *)(uVar9 + 0x34) +
               fVar4 * *(float *)(uVar9 + 100) +
               fVar5 * *(float *)(uVar9 + 0x94) + *(float *)(uVar9 + 0xc4)) * -fVar51;
          auVar21._8_4_ =
               (fVar39 * *(float *)(uVar9 + 0x38) +
               fVar4 * *(float *)(uVar9 + 0x68) +
               fVar5 * *(float *)(uVar9 + 0x98) + *(float *)(uVar9 + 200)) * -fVar52;
          auVar21._12_4_ =
               (fVar39 * *(float *)(uVar9 + 0x3c) +
               fVar4 * *(float *)(uVar9 + 0x6c) +
               fVar5 * *(float *)(uVar9 + 0x9c) + *(float *)(uVar9 + 0xcc)) * -fVar53;
          auVar18._0_4_ =
               (fVar39 * *(float *)(uVar9 + 0x40) +
               fVar4 * *(float *)(uVar9 + 0x70) +
               fVar5 * *(float *)(uVar9 + 0xa0) + *(float *)(uVar9 + 0xd0)) * -fVar55;
          auVar18._4_4_ =
               (fVar39 * *(float *)(uVar9 + 0x44) +
               fVar4 * *(float *)(uVar9 + 0x74) +
               fVar5 * *(float *)(uVar9 + 0xa4) + *(float *)(uVar9 + 0xd4)) * -fVar59;
          auVar18._8_4_ =
               (fVar39 * *(float *)(uVar9 + 0x48) +
               fVar4 * *(float *)(uVar9 + 0x78) +
               fVar5 * *(float *)(uVar9 + 0xa8) + *(float *)(uVar9 + 0xd8)) * -fVar60;
          auVar18._12_4_ =
               (fVar39 * *(float *)(uVar9 + 0x4c) +
               fVar4 * *(float *)(uVar9 + 0x7c) +
               fVar5 * *(float *)(uVar9 + 0xac) + *(float *)(uVar9 + 0xdc)) * -fVar61;
          auVar30._0_4_ = fVar40 + auVar25._0_4_;
          auVar30._4_4_ = fVar44 + auVar25._4_4_;
          auVar30._8_4_ = fVar45 + auVar25._8_4_;
          auVar30._12_4_ = fVar46 + auVar25._12_4_;
          auVar32._0_4_ = fVar47 + auVar21._0_4_;
          auVar32._4_4_ = fVar51 + auVar21._4_4_;
          auVar32._8_4_ = fVar52 + auVar21._8_4_;
          auVar32._12_4_ = fVar53 + auVar21._12_4_;
          auVar35._0_4_ = fVar55 + auVar18._0_4_;
          auVar35._4_4_ = fVar59 + auVar18._4_4_;
          auVar35._8_4_ = fVar60 + auVar18._8_4_;
          auVar35._12_4_ = fVar61 + auVar18._12_4_;
          auVar38 = vpminsd_avx(auVar21,auVar32);
          auVar33 = vpminsd_avx(auVar18,auVar35);
          auVar38 = vmaxps_avx(auVar38,auVar33);
          auVar41 = vpminsd_avx(auVar25,auVar30);
          auVar37 = vpmaxsd_avx(auVar25,auVar30);
          auVar33 = vpmaxsd_avx(auVar21,auVar32);
          auVar34 = vpmaxsd_avx(auVar18,auVar35);
          auVar34 = vminps_avx(auVar33,auVar34);
          auVar33 = vmaxps_avx(auVar27,auVar41);
          auVar38 = vmaxps_avx(auVar33,auVar38);
          auVar33 = vminps_avx(auVar31,auVar37);
          auVar33 = vminps_avx(auVar33,auVar34);
          auVar38 = vcmpps_avx(auVar38,auVar33,2);
          uVar8 = vmovmskps_avx(auVar38);
          bVar6 = (byte)uVar8;
        }
        if (bVar6 == 0) goto LAB_00b60097;
        uVar9 = uVar10 & 0xfffffffffffffff0;
        lVar3 = 0;
        if (bVar6 != 0) {
          for (; (bVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        uVar10 = *(ulong *)(uVar9 + lVar3 * 8);
        uVar11 = bVar6 - 1 & (uint)bVar6;
        uVar12 = (ulong)uVar11;
        if (uVar11 != 0) {
          do {
            *puVar14 = uVar10;
            puVar14 = puVar14 + 1;
            lVar3 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            uVar10 = *(ulong *)(uVar9 + lVar3 * 8);
            uVar12 = uVar12 - 1 & uVar12;
          } while (uVar12 != 0);
        }
        goto LAB_00b600a8;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }